

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmSourceFile *
anon_unknown.dwarf_ac7333::AddCustomCommand
          (cmLocalGenerator *lg,cmCommandOrigin origin,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  cmGlobalGenerator *pcVar1;
  pointer pcVar2;
  cmake *this;
  cmCustomCommandLine *pcVar3;
  cmCustomCommandLine *pcVar4;
  cmCustomCommandLine *pcVar5;
  cmListFileBacktrace *bt;
  cmCommandOrigin origin_00;
  cmMakefile *pcVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  cmCustomCommandLines *pcVar8;
  string *psVar9;
  cmSourceFile *this_00;
  cmCustomCommand *pcVar10;
  size_type sVar11;
  string *psVar12;
  cmCustomCommandLines *pcVar13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view input;
  string simple;
  string outName;
  cmCryptoHash h;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigOutputs;
  cmSourceFile *local_140;
  string local_130;
  string local_110;
  cmListFileBacktrace *local_f0;
  cmCommandOrigin local_e4;
  cmMakefile *local_e0;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_d8;
  string local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  cmCryptoHash local_a8;
  undefined1 local_98 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_88;
  string *local_58;
  string local_50;
  
  local_e0 = lg->Makefile;
  local_e4 = origin;
  local_f0 = cmCustomCommand::GetBacktrace
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  outputs = cmCustomCommand::GetOutputs_abi_cxx11_
                      ((cc->_M_t).
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_b0 = cmCustomCommand::GetByproducts_abi_cxx11_
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  pcVar8 = cmCustomCommand::GetCommandLines
                     ((cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  if (((pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pcVar10 = (cc->_M_t).
                super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
     pcVar10->HasMainDependency_ == true)) {
    psVar9 = cmCustomCommand::GetMainDependency_abi_cxx11_(pcVar10);
    pcVar6 = local_e0;
    this_00 = cmMakefile::GetSource(local_e0,psVar9,Ambiguous);
    if (this_00 == (cmSourceFile *)0x0) {
      local_140 = (cmSourceFile *)0x0;
      this_00 = cmMakefile::CreateSource(pcVar6,psVar9,false,Ambiguous);
      if (this_00 != (cmSourceFile *)0x0) goto LAB_002e18df;
    }
    else {
      pcVar10 = cmSourceFile::GetCustomCommand(this_00);
      if (pcVar10 == (cmCustomCommand *)0x0 || replace) goto LAB_002e18df;
      pcVar10 = cmSourceFile::GetCustomCommand(this_00);
      pcVar13 = cmCustomCommand::GetCommandLines(pcVar10);
      pcVar3 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      pcVar4 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pcVar5 = (pcVar13->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_140 = this_00;
      if (((long)pcVar4 - (long)pcVar3 ==
           (long)(pcVar13->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pcVar5) &&
         (bVar7 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                            (pcVar3,pcVar4,pcVar5), bVar7)) {
        return this_00;
      }
    }
  }
  pcVar1 = lg->GlobalGenerator;
  psVar9 = (outputs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar11 = cmGeneratorExpression::Find(psVar9);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  pcVar2 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar2,pcVar2 + psVar9->_M_string_length);
  if (sVar11 != 0xffffffffffffffff) {
    cmsys::SystemTools::ReplaceString(&local_130,"$<CONFIG>","(CONFIG)");
    sVar11 = cmGeneratorExpression::Find(&local_130);
    if (sVar11 != 0xffffffffffffffff) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      cmLocalGenerator::ExpandCustomCommandOutputGenex
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98,lg,psVar9,local_f0);
      if (local_98._8_8_ - local_98._0_8_ == 0x20) {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,*(long *)local_98._0_8_,
                   (long)&((*(pointer *)(local_98._0_8_ + 8))->CurrentScope).Tree +
                   *(long *)local_98._0_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
        cmCryptoHash::cmCryptoHash(&local_a8,AlgoSHA256);
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)local_98,&(lg->super_cmOutputConverter).StateSnapshot);
        psVar12 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_98);
        input._M_str = (psVar9->_M_dataplus)._M_p;
        input._M_len = psVar9->_M_string_length;
        cmCryptoHash::HashString_abi_cxx11_(&local_50,&local_a8,input);
        std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_50);
        local_98._8_8_ = (psVar12->_M_dataplus)._M_p;
        local_98._0_8_ = psVar12->_M_string_length;
        local_88.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc;
        local_88.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x8cb329;
        local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_110._M_string_length;
        local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_110._M_dataplus._M_p;
        views._M_len = 3;
        views._M_array = (iterator)local_98;
        local_58 = &local_110;
        cmCatViews(&local_130,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmCryptoHash::~cmCryptoHash(&local_a8);
      }
    }
  }
  (*pcVar1->_vptr_cmGlobalGenerator[0x36])(&local_d0,pcVar1,&local_130);
  pcVar6 = local_e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  this_00 = cmMakefile::GetSource(pcVar6,&local_d0,Known);
  if (this_00 == (cmSourceFile *)0x0) {
    this_00 = cmMakefile::CreateSource(pcVar6,&local_d0,true,Known);
LAB_002e1821:
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"__CMAKE_RULE","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"1","");
    cmSourceFile::SetProperty(this_00,(string *)local_98,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)local_88.Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    bVar7 = true;
  }
  else {
    pcVar10 = cmSourceFile::GetCustomCommand(this_00);
    if (pcVar10 == (cmCustomCommand *)0x0 || replace) goto LAB_002e1821;
    pcVar10 = cmSourceFile::GetCustomCommand(this_00);
    pcVar13 = cmCustomCommand::GetCommandLines(pcVar10);
    pcVar3 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar5 = (pcVar13->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)pcVar4 - (long)pcVar3 !=
         (long)(pcVar13->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)pcVar5) ||
       (bVar7 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                          (pcVar3,pcVar4,pcVar5), !bVar7)) {
      this = lg->GlobalGenerator->CMakeInstance;
      local_98._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x29;
      local_98._8_8_ = "Attempt to add a custom rule to output\n  ";
      local_88.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d0._M_string_length;
      local_88.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d0._M_dataplus._M_p;
      local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x21;
      local_88.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x88fdd0;
      local_58 = (string *)0x0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_98;
      cmCatViews(&local_110,views_00);
      cmake::IssueMessage(this,FATAL_ERROR,&local_110,local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    bVar7 = false;
    local_140 = this_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return local_140;
  }
LAB_002e18df:
  cmCustomCommand::SetEscapeAllowMakeVars
            ((cc->_M_t).
             super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
             super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,true);
  origin_00 = local_e4;
  bt = local_f0;
  cmLocalGenerator::AddSourceOutputs(lg,this_00,outputs,Primary,local_f0,local_e4);
  cmLocalGenerator::AddSourceOutputs(lg,this_00,local_b0,Byproduct,bt,origin_00);
  local_d8._M_head_impl =
       (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
       .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
       super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
  (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
  cmSourceFile::SetCustomCommand
            (this_00,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d8
            );
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d8);
  return this_00;
}

Assistant:

cmSourceFile* AddCustomCommand(cmLocalGenerator& lg, cmCommandOrigin origin,
                               std::unique_ptr<cmCustomCommand> cc,
                               bool replace)
{
  cmMakefile* mf = lg.GetMakefile();
  const auto& lfbt = cc->GetBacktrace();
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && cc->HasMainDependency()) {
    const auto& main_dependency = cc->GetMainDependency();
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = mf->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = mf->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = lg.GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(
      ComputeCustomCommandRuleFileName(lg, lfbt, outputs[0]));

    // Check if the rule file already exists.
    file = mf->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        lg.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Attempt to add a custom rule to output\n  ", outName,
                   "\nwhich already has a custom rule."),
          lfbt);
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = mf->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Attach the custom command to the file.
  if (file) {
    cc->SetEscapeAllowMakeVars(true);

    lg.AddSourceOutputs(file, outputs, cmLocalGenerator::OutputRole::Primary,
                        lfbt, origin);
    lg.AddSourceOutputs(file, byproducts,
                        cmLocalGenerator::OutputRole::Byproduct, lfbt, origin);

    file->SetCustomCommand(std::move(cc));
  }
  return file;
}